

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void PStruct::WriteFields(FArchive *ar,void *addr,TArray<PField_*,_PField_*> *fields)

{
  PField *pPVar1;
  uint uVar2;
  PField **ppPVar3;
  char *name;
  PField *field;
  uint i;
  TArray<PField_*,_PField_*> *fields_local;
  void *addr_local;
  FArchive *ar_local;
  
  field._4_4_ = 0;
  while( true ) {
    uVar2 = TArray<PField_*,_PField_*>::Size(fields);
    if (uVar2 <= field._4_4_) break;
    ppPVar3 = TArray<PField_*,_PField_*>::operator[](fields,(ulong)field._4_4_);
    pPVar1 = *ppPVar3;
    if ((pPVar1->Flags & 8) == 0) {
      name = FName::operator_cast_to_char_
                       ((FName *)&(pPVar1->super_PSymbol).super_DObject.field_0x24);
      FArchive::WriteName(ar,name);
      (*(pPVar1->Type->super_DObject)._vptr_DObject[7])
                (pPVar1->Type,ar,(long)addr + (ulong)pPVar1->Offset);
    }
    field._4_4_ = field._4_4_ + 1;
  }
  FArchive::WriteName(ar,(char *)0x0);
  return;
}

Assistant:

void PStruct::WriteFields(FArchive &ar, const void *addr, const TArray<PField *> &fields)
{
	for (unsigned i = 0; i < fields.Size(); ++i)
	{
		const PField *field = fields[i];
		// Skip fields with native serialization
		if (!(field->Flags & VARF_Native))
		{
			ar.WriteName(field->SymbolName);
			field->Type->WriteValue(ar, (const BYTE *)addr + field->Offset);
		}
	}
	ar.WriteName(NULL);
}